

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O3

void adjalign(int n)

{
  int iVar1;
  int iVar2;
  
  iVar1 = u.ualign.record + n;
  iVar2 = iVar1;
  if (((-1 < n) && (iVar2 = u.ualign.record, n != 0)) && (iVar2 = moves / 200 + 10, iVar1 < iVar2))
  {
    iVar2 = iVar1;
  }
  u.ualign.record = iVar2;
  return;
}

Assistant:

void adjalign(int n)
{
	int newalign = u.ualign.record + n;

	if (n < 0) {
		if (newalign < u.ualign.record)
			u.ualign.record = newalign;
	} else
		if (newalign > u.ualign.record) {
			u.ualign.record = newalign;
			if (u.ualign.record > ALIGNLIM)
				u.ualign.record = ALIGNLIM;
		}
}